

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularMatrixMatrix.h
# Opt level: O0

void Eigen::internal::
     triangular_product_impl<5,true,Eigen::Block<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>const,-1,-1,true>,-1,-1,false>const,false,Eigen::Matrix<float,-1,-1,0,-1,1>,false>
     ::run<Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>,_1,_1,false>>
               (Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false> *dst,
               Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>
               *a_lhs,Matrix<float,__1,__1,_0,__1,_1> *a_rhs,Scalar *alpha)

{
  long _depth;
  Index _cols;
  Index _rows;
  long *plVar1;
  Scalar *_lhs;
  Index lhsStride;
  Scalar *_rhs;
  Index rhsStride;
  ScalarWithConstIfNotLvalue *_res;
  Index resIncr;
  Index resStride;
  Type local_1d8;
  float local_16c;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>,_const_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>
  local_168;
  Type local_138;
  Index local_e8;
  Index local_e0;
  long local_d8;
  Index diagSize;
  undefined1 local_c0 [8];
  BlockingType blocking;
  Index local_80;
  long local_78;
  Index stripedDepth;
  Index stripedCols;
  Index stripedRows;
  Scalar local_58;
  Scalar actualAlpha;
  RhsScalar rhs_alpha;
  LhsScalar lhs_alpha;
  type rhs;
  type lhs;
  Scalar *alpha_local;
  Matrix<float,__1,__1,_0,__1,_1> *a_rhs_local;
  Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>
  *a_lhs_local;
  Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false> *dst_local;
  
  lhs = (type)alpha;
  alpha_local = (Scalar *)a_rhs;
  a_rhs_local = (Matrix<float,__1,__1,_0,__1,_1> *)a_lhs;
  a_lhs_local = (Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>
                 *)dst;
  rhs = (type)blas_traits<Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_-1,_false>_>
              ::extract(a_lhs);
  _rhs_alpha = &blas_traits<Eigen::Matrix<float,_-1,_-1,_0,_-1,_1>_>::extract
                          ((Matrix<float,__1,__1,_0,__1,_1> *)alpha_local)->
                super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,_1>_>;
  actualAlpha = blas_traits<Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_-1,_false>_>
                ::extractScalarFactor
                          ((Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>
                            *)a_rhs_local);
  local_58 = blas_traits<Eigen::Matrix<float,_-1,_-1,_0,_-1,_1>_>::extractScalarFactor
                       ((Matrix<float,__1,__1,_0,__1,_1> *)alpha_local);
  stripedRows._4_4_ =
       *(float *)&(lhs->
                  super_BlockImpl<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false,_Eigen::Dense>
                  ).
                  super_BlockImpl_dense<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false,_true>
                  .
                  super_MapBase<Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,_0>
                  .m_data * actualAlpha * local_58;
  stripedCols = MapBase<Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_-1,_false>,_0>
                ::rows((MapBase<Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,_0>
                        *)rhs);
  stripedDepth = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_1>_>::cols(_rhs_alpha);
  local_80 = MapBase<Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_-1,_false>,_0>
             ::cols((MapBase<Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,_0>
                     *)rhs);
  blocking.m_sizeB =
       MapBase<Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_-1,_false>,_0>
       ::rows((MapBase<Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,_0>
               *)rhs);
  plVar1 = std::min<long>(&local_80,&blocking.m_sizeB);
  local_78 = *plVar1;
  gemm_blocking_space<0,_float,_float,_-1,_1,_-1,_4,_false>::gemm_blocking_space
            ((gemm_blocking_space<0,_float,_float,__1,_1,__1,_4,_false> *)local_c0,stripedCols,
             stripedDepth,local_78,1,false);
  _rows = stripedCols;
  _cols = stripedDepth;
  _depth = local_78;
  _lhs = MapBase<Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_-1,_false>,_0>
         ::coeffRef((MapBase<Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,_0>
                     *)rhs,0,0);
  lhsStride = BlockImpl_dense<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_-1,_false,_true>
              ::outerStride((BlockImpl_dense<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false,_true>
                             *)rhs);
  _rhs = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_1>_>::coeffRef(_rhs_alpha,0,0);
  rhsStride = Matrix<float,_-1,_-1,_0,_-1,_1>::outerStride
                        ((Matrix<float,__1,__1,_0,__1,_1> *)_rhs_alpha);
  _res = MapBase<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>,_1>::coeffRef
                   ((MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,_1>
                     *)a_lhs_local,0,0);
  resIncr = BlockImpl_dense<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false,_true>::innerStride
                      ((BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false,_true>
                        *)a_lhs_local);
  resStride = BlockImpl_dense<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false,_true>::
              outerStride((BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false,_true>
                           *)a_lhs_local);
  product_triangular_matrix_matrix<float,_long,_5,_true,_0,_false,_0,_false,_0,_1,_0>::run
            (_rows,_cols,_depth,_lhs,lhsStride,_rhs,rhsStride,_res,resIncr,resStride,
             (float *)((long)&stripedRows + 4),(level3_blocking<float,_float> *)local_c0);
  if ((actualAlpha != 1.0) || (NAN(actualAlpha))) {
    local_e0 = MapBase<Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_-1,_false>,_0>
               ::rows((MapBase<Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,_0>
                       *)rhs);
    local_e8 = MapBase<Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_-1,_false>,_0>
               ::cols((MapBase<Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,_0>
                       *)rhs);
    plVar1 = std::min<long>(&local_e0,&local_e8);
    local_d8 = *plVar1;
    local_16c = actualAlpha + -1.0;
    Eigen::operator*(&local_168,&local_16c,(StorageBaseType *)alpha_local);
    DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_1>_>,_const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_1>_>_>
    ::topRows<long>(&local_138,
                    (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>,_const_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>_>
                     *)&local_168,local_d8);
    DenseBase<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>_>::topRows<long>
              (&local_1d8,
               (DenseBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>_> *)
               a_lhs_local,local_d8);
    MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,-1,1,0,-1,1>,-1,-1,false>,-1,-1,false>>
    ::operator-=((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>,_1,_1,false>,_1,_1,false>>
                  *)&local_1d8,
                 (MatrixBase<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>,_const_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>,__1,__1,_false>_>
                  *)&local_138);
  }
  gemm_blocking_space<0,_float,_float,_-1,_1,_-1,_4,_false>::~gemm_blocking_space
            ((gemm_blocking_space<0,_float,_float,__1,_1,__1,_4,_false> *)local_c0);
  return;
}

Assistant:

static void run(Dest& dst, const Lhs &a_lhs, const Rhs &a_rhs, const typename Dest::Scalar& alpha)
  {
    typedef typename Lhs::Scalar  LhsScalar;
    typedef typename Rhs::Scalar  RhsScalar;
    typedef typename Dest::Scalar Scalar;
    
    typedef internal::blas_traits<Lhs> LhsBlasTraits;
    typedef typename LhsBlasTraits::DirectLinearAccessType ActualLhsType;
    typedef typename internal::remove_all<ActualLhsType>::type ActualLhsTypeCleaned;
    typedef internal::blas_traits<Rhs> RhsBlasTraits;
    typedef typename RhsBlasTraits::DirectLinearAccessType ActualRhsType;
    typedef typename internal::remove_all<ActualRhsType>::type ActualRhsTypeCleaned;
    
    typename internal::add_const_on_value_type<ActualLhsType>::type lhs = LhsBlasTraits::extract(a_lhs);
    typename internal::add_const_on_value_type<ActualRhsType>::type rhs = RhsBlasTraits::extract(a_rhs);

    LhsScalar lhs_alpha = LhsBlasTraits::extractScalarFactor(a_lhs);
    RhsScalar rhs_alpha = RhsBlasTraits::extractScalarFactor(a_rhs);
    Scalar actualAlpha = alpha * lhs_alpha * rhs_alpha;

    typedef internal::gemm_blocking_space<(Dest::Flags&RowMajorBit) ? RowMajor : ColMajor,Scalar,Scalar,
              Lhs::MaxRowsAtCompileTime, Rhs::MaxColsAtCompileTime, Lhs::MaxColsAtCompileTime,4> BlockingType;

    enum { IsLower = (Mode&Lower) == Lower };
    Index stripedRows  = ((!LhsIsTriangular) || (IsLower))  ? lhs.rows() : (std::min)(lhs.rows(),lhs.cols());
    Index stripedCols  = ((LhsIsTriangular)  || (!IsLower)) ? rhs.cols() : (std::min)(rhs.cols(),rhs.rows());
    Index stripedDepth = LhsIsTriangular ? ((!IsLower) ? lhs.cols() : (std::min)(lhs.cols(),lhs.rows()))
                                         : ((IsLower)  ? rhs.rows() : (std::min)(rhs.rows(),rhs.cols()));

    BlockingType blocking(stripedRows, stripedCols, stripedDepth, 1, false);

    internal::product_triangular_matrix_matrix<Scalar, Index,
      Mode, LhsIsTriangular,
      (internal::traits<ActualLhsTypeCleaned>::Flags&RowMajorBit) ? RowMajor : ColMajor, LhsBlasTraits::NeedToConjugate,
      (internal::traits<ActualRhsTypeCleaned>::Flags&RowMajorBit) ? RowMajor : ColMajor, RhsBlasTraits::NeedToConjugate,
      (internal::traits<Dest          >::Flags&RowMajorBit) ? RowMajor : ColMajor, Dest::InnerStrideAtCompileTime>
      ::run(
        stripedRows, stripedCols, stripedDepth,   // sizes
        &lhs.coeffRef(0,0), lhs.outerStride(),    // lhs info
        &rhs.coeffRef(0,0), rhs.outerStride(),    // rhs info
        &dst.coeffRef(0,0), dst.innerStride(), dst.outerStride(),    // result info
        actualAlpha, blocking
      );

    // Apply correction if the diagonal is unit and a scalar factor was nested:
    if ((Mode&UnitDiag)==UnitDiag)
    {
      if (LhsIsTriangular && lhs_alpha!=LhsScalar(1))
      {
        Index diagSize = (std::min)(lhs.rows(),lhs.cols());
        dst.topRows(diagSize) -= ((lhs_alpha-LhsScalar(1))*a_rhs).topRows(diagSize);
      }
      else if ((!LhsIsTriangular) && rhs_alpha!=RhsScalar(1))
      {
        Index diagSize = (std::min)(rhs.rows(),rhs.cols());
        dst.leftCols(diagSize) -= (rhs_alpha-RhsScalar(1))*a_lhs.leftCols(diagSize);
      }
    }
  }